

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sandbox.cpp
# Opt level: O2

void __thiscall Sandbox::printDependencies(Sandbox *this,ShaderType _type)

{
  pointer pbVar1;
  ostream *poVar2;
  size_t i;
  ulong uVar3;
  long lVar4;
  
  lVar4 = 0;
  uVar3 = 0;
  if (_type == FRAGMENT) {
    for (; pbVar1 = (this->m_frag_dependencies).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
        uVar3 < (ulong)((long)(this->m_frag_dependencies).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
        uVar3 = uVar3 + 1) {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               (string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar4));
      std::endl<char,std::char_traits<char>>(poVar2);
      lVar4 = lVar4 + 0x20;
    }
  }
  else {
    for (; pbVar1 = (this->m_vert_dependencies).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
        uVar3 < (ulong)((long)(this->m_vert_dependencies).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
        uVar3 = uVar3 + 1) {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               (string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar4));
      std::endl<char,std::char_traits<char>>(poVar2);
      lVar4 = lVar4 + 0x20;
    }
  }
  return;
}

Assistant:

void Sandbox::printDependencies(ShaderType _type) const {
    if (_type == FRAGMENT)
        for (size_t i = 0; i < m_frag_dependencies.size(); i++)
            std::cout << m_frag_dependencies[i] << std::endl;
    
    else 
        for (size_t i = 0; i < m_vert_dependencies.size(); i++)
            std::cout << m_vert_dependencies[i] << std::endl;
}